

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O1

void __thiscall
CLI::Validator::Validator
          (Validator *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *op,string *validator_desc,string *validator_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  anon_class_32_1_5ff8519c local_48;
  
  paVar1 = &local_48.validator_desc.field_2;
  pcVar3 = (validator_desc->_M_dataplus)._M_p;
  local_48.validator_desc._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + validator_desc->_M_string_length);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Validator::Validator(std::function<std::__cxx11::string(std::__cxx11::string&)>,std::__cxx11::string,std::__cxx11::string)::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.validator_desc._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.validator_desc._M_dataplus._M_p);
  }
  *(undefined8 *)&(this->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = 0;
  (this->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->func_)._M_invoker = op->_M_invoker;
  if ((op->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar4 = *(undefined8 *)((long)&(op->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->func_).super__Function_base._M_functor =
         *(undefined8 *)&(op->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = uVar4;
    (this->func_).super__Function_base._M_manager = (op->super__Function_base)._M_manager;
    (op->super__Function_base)._M_manager = (_Manager_type)0x0;
    op->_M_invoker = (_Invoker_type)0x0;
  }
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (validator_name->_M_dataplus)._M_p;
  paVar2 = &validator_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&validator_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar4;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar3;
    (this->name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = validator_name->_M_string_length;
  (validator_name->_M_dataplus)._M_p = (pointer)paVar2;
  validator_name->_M_string_length = 0;
  (validator_name->field_2)._M_local_buf[0] = '\0';
  this->application_index_ = -1;
  this->active_ = true;
  this->non_modifying_ = false;
  return;
}

Assistant:

Validator(std::function<std::string(std::string &)> op, std::string validator_desc, std::string validator_name = "")
        : desc_function_([validator_desc]() { return validator_desc; }), func_(std::move(op)),
          name_(std::move(validator_name)) {}